

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3cb2mllr_io.c
# Opt level: O2

int s3cb2mllr_read(char *fn,int32 **out_cb2mllr,uint32 *out_n_cb,uint32 *out_n_mllr)

{
  uint uVar1;
  int iVar2;
  int32 *piVar3;
  int iVar4;
  void *ptr;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  iVar4 = s3map_read(fn,out_cb2mllr,out_n_cb,out_n_mllr,4);
  if (iVar4 == 0) {
    uVar1 = *out_n_cb;
    piVar3 = *out_cb2mllr;
    ptr = __ckd_calloc__((long)(int)*out_n_mllr,4,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
                         ,0x50);
    uVar8 = 0;
    uVar6 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar6 = uVar8;
    }
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      uVar1 = piVar3[uVar8];
      if ((int)*out_n_mllr <= (int)uVar1) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
                ,0x55,"%s cb2mllr[%d] -> %d which is >= n_mllr_class (%d)\n",fn,uVar8,(ulong)uVar1,
                (ulong)*out_n_mllr);
        goto LAB_00108352;
      }
      if (-1 < (int)uVar1) {
        *(undefined4 *)((long)ptr + (ulong)uVar1 * 4) = 1;
      }
    }
    bVar10 = false;
    uVar8 = 0;
    for (uVar9 = 0; uVar6 != uVar9; uVar9 = uVar9 + 1) {
      lVar7 = (long)piVar3[uVar9];
      if (-1 < lVar7) {
        iVar2 = *(int *)((long)ptr + lVar7 * 4);
        iVar5 = (int)uVar9;
        if (bVar10) {
          if (iVar2 == 1) {
            lVar7 = 0x62;
            goto LAB_0010834b;
          }
          bVar10 = true;
        }
        else {
          bVar10 = iVar2 == 0;
          if (bVar10) {
            uVar8 = uVar9 & 0xffffffff;
          }
        }
      }
    }
    if (bVar10) {
      iVar5 = (int)uVar6;
      lVar7 = 0x67;
LAB_0010834b:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3cb2mllr_io.c"
              ,lVar7,"cb unmapped in region [%u %u]\n",uVar8,(ulong)(iVar5 - 1));
LAB_00108352:
      exit(1);
    }
    ckd_free(ptr);
  }
  return iVar4;
}

Assistant:

int
s3cb2mllr_read(const char *fn,
	       int32 **out_cb2mllr,
	       uint32 *out_n_cb,
	       uint32 *out_n_mllr)
{
    int ret, i, n_d, n_r;
    int *did_map;
    int32 *cb2mllr;
    int in_hole = FALSE;
    int beg_hole = 0;

    ret = s3map_read(fn,
		     (void **)out_cb2mllr,
		     out_n_cb,
		     out_n_mllr,
		     sizeof(int32));

    
    if (ret == S3_SUCCESS) {
	n_d = *out_n_cb;
	n_r = *out_n_mllr;
	cb2mllr = *out_cb2mllr;
	
	did_map = ckd_calloc(n_r, sizeof(int));

	for (i = 0; i < n_d; i++) {
	    if (cb2mllr[i] >= (int32)*out_n_mllr) {
		E_FATAL("%s cb2mllr[%d] -> %d which is >= n_mllr_class (%d)\n",
			fn, i, cb2mllr[i], *out_n_mllr);
	    }
	    else if (cb2mllr[i] >= 0)
		did_map[cb2mllr[i]] = IS_MAPPED;
	}
	
	for (i = 0; i < n_d; i++) {
	    if (cb2mllr[i] < 0) continue; /* skipped */
	    if (!in_hole && (did_map[cb2mllr[i]] == NOT_MAPPED)) {
		beg_hole = i;
		in_hole = TRUE;
	    }
	    if (in_hole && (did_map[cb2mllr[i]] == IS_MAPPED)) {
		E_FATAL("cb unmapped in region [%u %u]\n", beg_hole, i-1);
		in_hole = FALSE;
	    }
	}
	if (in_hole) {
	    E_FATAL("cb unmapped in region [%u %u]\n", beg_hole, i-1);
	}

	ckd_free(did_map);
    }

    return ret;
}